

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void __thiscall
ImGuiInputTextCallbackData::InsertChars
          (ImGuiInputTextCallbackData *this,int pos,char *new_text,char *new_text_end)

{
  uint uVar1;
  char *__src;
  ImGuiContext *pIVar2;
  int iVar3;
  size_t sVar4;
  char *__dest;
  int iVar5;
  int iVar6;
  int iVar7;
  
  uVar1 = this->Flags;
  if (new_text_end == (char *)0x0) {
    sVar4 = strlen(new_text);
    iVar7 = (int)sVar4;
  }
  else {
    iVar7 = (int)new_text_end - (int)new_text;
  }
  pIVar2 = GImGui;
  iVar3 = this->BufTextLen;
  if (this->BufSize <= iVar3 + iVar7) {
    if ((uVar1 >> 0x12 & 1) == 0) {
      return;
    }
    iVar5 = 0x100;
    if (0x100 < iVar7) {
      iVar5 = iVar7;
    }
    if (iVar7 * 4 < iVar5) {
      iVar5 = iVar7 * 4;
    }
    iVar6 = 0x20;
    if (7 < iVar7) {
      iVar6 = iVar5;
    }
    iVar5 = iVar6 + iVar3 + 1;
    iVar6 = iVar6 + iVar3 + 2;
    if ((GImGui->InputTextState).TempBuffer.Capacity < iVar6) {
      __dest = (char *)ImGui::MemAlloc((long)iVar6);
      __src = (pIVar2->InputTextState).TempBuffer.Data;
      if (__src != (char *)0x0) {
        memcpy(__dest,__src,(long)(pIVar2->InputTextState).TempBuffer.Size);
        ImGui::MemFree((pIVar2->InputTextState).TempBuffer.Data);
      }
      (pIVar2->InputTextState).TempBuffer.Data = __dest;
      (pIVar2->InputTextState).TempBuffer.Capacity = iVar6;
      iVar3 = this->BufTextLen;
    }
    else {
      __dest = (GImGui->InputTextState).TempBuffer.Data;
    }
    this->Buf = __dest;
    (pIVar2->InputTextState).BufCapacityA = iVar5;
    this->BufSize = iVar5;
  }
  if (iVar3 - pos != 0) {
    memmove(this->Buf + pos + iVar7,this->Buf + pos,(long)(iVar3 - pos));
  }
  memcpy(this->Buf + pos,new_text,(long)iVar7);
  this->Buf[(long)iVar7 + (long)this->BufTextLen] = '\0';
  iVar3 = this->CursorPos;
  if (pos <= iVar3) {
    iVar3 = iVar3 + iVar7;
    this->CursorPos = iVar3;
  }
  this->SelectionEnd = iVar3;
  this->SelectionStart = iVar3;
  this->BufDirty = true;
  this->BufTextLen = this->BufTextLen + iVar7;
  return;
}

Assistant:

void ImGuiInputTextCallbackData::InsertChars(int pos, const char* new_text, const char* new_text_end)
{
    const bool is_resizable = (Flags & ImGuiInputTextFlags_CallbackResize) != 0;
    const int new_text_len = new_text_end ? (int)(new_text_end - new_text) : (int)strlen(new_text);
    if (new_text_len + BufTextLen >= BufSize)
    {
        if (!is_resizable)
            return;

        // Contrary to STB_TEXTEDIT_INSERTCHARS() this is working in the UTF8 buffer, hence the midly similar code (until we remove the U16 buffer alltogether!)
        ImGuiContext& g = *GImGui;
        ImGuiInputTextState* edit_state = &g.InputTextState;
        IM_ASSERT(edit_state->ID != 0 && g.ActiveId == edit_state->ID);
        IM_ASSERT(Buf == edit_state->TempBuffer.Data);
        int new_buf_size = BufTextLen + ImClamp(new_text_len * 4, 32, ImMax(256, new_text_len)) + 1;
        edit_state->TempBuffer.reserve(new_buf_size + 1);
        Buf = edit_state->TempBuffer.Data;
        BufSize = edit_state->BufCapacityA = new_buf_size;
    }

    if (BufTextLen != pos)
        memmove(Buf + pos + new_text_len, Buf + pos, (size_t)(BufTextLen - pos));
    memcpy(Buf + pos, new_text, (size_t)new_text_len * sizeof(char));
    Buf[BufTextLen + new_text_len] = '\0';

    if (CursorPos >= pos)
        CursorPos += new_text_len;
    SelectionStart = SelectionEnd = CursorPos;
    BufDirty = true;
    BufTextLen += new_text_len;
}